

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O3

bool __thiscall
Rml::DecoratorRadialGradient::Initialise
          (DecoratorRadialGradient *this,bool in_repeating,Shape in_shape,SizeType in_size_type,
          Vector2Numeric in_size,Vector2Numeric in_position,ColorStopList *in_color_stops)

{
  this->repeating = in_repeating;
  this->shape = in_shape;
  this->size_type = in_size_type;
  (this->size).x = in_size.x;
  (this->size).y = in_size.y;
  (this->position).x = in_position.x;
  (this->position).y = in_position.y;
  ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
            (&this->color_stops,in_color_stops);
  return (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (this->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool DecoratorRadialGradient::Initialise(bool in_repeating, Shape in_shape, SizeType in_size_type, Vector2Numeric in_size, Vector2Numeric in_position,
	const ColorStopList& in_color_stops)
{
	repeating = in_repeating;
	shape = in_shape;
	size_type = in_size_type;
	size = in_size;
	position = in_position;
	color_stops = in_color_stops;
	return !color_stops.empty();
}